

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::MergePartialFromImpl<false>
          (internal *this,BoundedZCIS input,MessageLite *msg)

{
  bool bVar1;
  char *ptr;
  ParseContext ctx;
  char *local_a8;
  internal *local_a0;
  int local_98 [2];
  ParseContext local_90;
  
  local_98[0] = (int)input.zcis;
  bVar1 = false;
  local_a0 = this;
  ParseContext::ParseContext<google::protobuf::io::ZeroCopyInputStream*&,int&>
            (&local_90,io::CodedInputStream::default_recursion_limit_,false,&local_a8,
             (ZeroCopyInputStream **)&local_a0,local_98);
  local_a8 = (char *)(**(code **)(*input._8_8_ + 0x68))(input._8_8_,local_a8,&local_90);
  if (local_a8 != (char *)0x0) {
    EpsCopyInputStream::BackUp(&local_90.super_EpsCopyInputStream,local_a8);
    bVar1 = local_90.super_EpsCopyInputStream.last_tag_minus_1_ == 0;
  }
  return bVar1;
}

Assistant:

bool MergePartialFromImpl(BoundedZCIS input, MessageLite* msg) {
  const char* ptr;
  internal::ParseContext ctx(io::CodedInputStream::GetDefaultRecursionLimit(),
                             aliasing, &ptr, input.zcis, input.limit);
  ptr = msg->_InternalParse(ptr, &ctx);
  if (PROTOBUF_PREDICT_FALSE(!ptr)) return false;
  ctx.BackUp(ptr);
  return ctx.EndedAtLimit();
}